

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAtomTypesSectionParser.cpp
# Opt level: O2

void __thiscall
OpenMD::EAMAtomTypesSectionParser::parseFuncflFile
          (EAMAtomTypesSectionParser *this,ForceField *ff,EAMAdapter ea,string *funcflFile,
          int param_4)

{
  double dVar1;
  RealType RVar2;
  int iVar3;
  int num;
  ifstrstream *input;
  long *plVar4;
  pointer pdVar5;
  ifstrstream *this_00;
  vector<double,_std::allocator<double>_> F;
  vector<double,_std::allocator<double>_> rho;
  vector<double,_std::allocator<double>_> Z;
  StringTokenizer tokenizer1;
  string lattice;
  char buffer [65535];
  allocator<char> aStack_101ca;
  allocator<char> aStack_101c9;
  double dStack_101c8;
  double dStack_101c0;
  double dStack_101b8;
  RealType RStack_101b0;
  _Vector_base<double,_std::allocator<double>_> _Stack_101a8;
  string sStack_10188;
  _Vector_base<double,_std::allocator<double>_> _Stack_10168;
  _Vector_base<double,_std::allocator<double>_> _Stack_10148;
  string sStack_10130;
  EAMAdapter EStack_10110;
  undefined1 auStack_10108 [112];
  _Vector_base<double,_std::allocator<double>_> _Stack_10098;
  undefined1 *puStack_10080;
  undefined8 uStack_10078;
  undefined1 auStack_10070 [16];
  _Vector_base<double,_std::allocator<double>_> _Stack_10060;
  string sStack_10048;
  char acStack_10028 [65544];
  
  EStack_10110.at_ = ea.at_;
  input = ForceField::openForceFieldFile(ff,funcflFile);
  std::istream::getline((char *)input,(long)acStack_10028);
  puStack_10080 = auStack_10070;
  uStack_10078 = 0;
  auStack_10070[0] = 0;
  _Stack_101a8._M_impl.super__Vector_impl_data._M_start = (double *)0x0;
  _Stack_101a8._M_impl.super__Vector_impl_data._M_finish = (double *)0x0;
  _Stack_101a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Stack_10148._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_10148._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_10148._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Stack_10168._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_10168._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_10168._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  plVar4 = (long *)std::istream::getline((char *)input,(long)acStack_10028);
  dStack_101b8 = 0.0;
  if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_10188,acStack_10028,&aStack_101c9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_10130," ;\t\n\r",&aStack_101ca);
    StringTokenizer::StringTokenizer((StringTokenizer *)auStack_10108,&sStack_10188,&sStack_10130);
    std::__cxx11::string::~string((string *)&sStack_10130);
    std::__cxx11::string::~string((string *)&sStack_10188);
    iVar3 = StringTokenizer::countTokens((StringTokenizer *)auStack_10108);
    if (iVar3 < 4) {
      builtin_strncpy(painCave.errMsg,"EAMAtomTypesSectionParser Error: Not enough tokens\n",0x34);
      painCave.isFatal = 1;
      dStack_101b8 = 0.0;
      simError();
    }
    else {
      StringTokenizer::nextTokenAsInt((StringTokenizer *)auStack_10108);
      StringTokenizer::nextTokenAsDouble((StringTokenizer *)auStack_10108);
      dStack_101b8 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)auStack_10108);
      dStack_101c8 = this->dus_;
      StringTokenizer::nextToken_abi_cxx11_(&sStack_10188,(StringTokenizer *)auStack_10108);
      dStack_101b8 = dStack_101b8 * dStack_101c8;
      std::__cxx11::string::operator=((string *)&puStack_10080,(string *)&sStack_10188);
      std::__cxx11::string::~string((string *)&sStack_10188);
    }
    StringTokenizer::~StringTokenizer((StringTokenizer *)auStack_10108);
  }
  this_00 = input;
  plVar4 = (long *)std::istream::getline((char *)input,(long)acStack_10028);
  if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_10188,acStack_10028,&aStack_101c9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_10130," ;\t\n\r",&aStack_101ca);
    StringTokenizer::StringTokenizer((StringTokenizer *)auStack_10108,&sStack_10188,&sStack_10130);
    std::__cxx11::string::~string((string *)&sStack_10130);
    std::__cxx11::string::~string((string *)&sStack_10188);
    iVar3 = StringTokenizer::countTokens((StringTokenizer *)auStack_10108);
    if (iVar3 < 5) {
      builtin_strncpy(painCave.errMsg,"EAMAtomTypesSectionParser Error: Not enough tokens\n",0x34);
      painCave.isFatal = 1;
      simError();
      num = 0;
      dStack_101c8 = 0.0;
      dStack_101c0 = 0.0;
      RStack_101b0 = 0.0;
      iVar3 = 0;
    }
    else {
      iVar3 = StringTokenizer::nextTokenAsInt((StringTokenizer *)auStack_10108);
      RStack_101b0 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)auStack_10108);
      num = StringTokenizer::nextTokenAsInt((StringTokenizer *)auStack_10108);
      dStack_101c8 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)auStack_10108);
      dStack_101c0 = this->dus_;
      RVar2 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)auStack_10108);
      dStack_101c8 = dStack_101c8 * dStack_101c0;
      dStack_101c0 = RVar2 * this->dus_;
    }
    this_00 = (ifstrstream *)auStack_10108;
    StringTokenizer::~StringTokenizer((StringTokenizer *)this_00);
  }
  else {
    num = 0;
    dStack_101c8 = 0.0;
    dStack_101c0 = 0.0;
    RStack_101b0 = 0.0;
    iVar3 = 0;
  }
  parseEAMArray((EAMAtomTypesSectionParser *)this_00,
                &input->super_basic_istream<char,_std::char_traits<char>_>,
                (vector<double,_std::allocator<double>_> *)&_Stack_101a8,iVar3);
  parseEAMArray((EAMAtomTypesSectionParser *)this_00,
                &input->super_basic_istream<char,_std::char_traits<char>_>,
                (vector<double,_std::allocator<double>_> *)&_Stack_10148,num);
  parseEAMArray((EAMAtomTypesSectionParser *)this_00,
                &input->super_basic_istream<char,_std::char_traits<char>_>,
                (vector<double,_std::allocator<double>_> *)&_Stack_10168,num);
  dVar1 = this->eus_;
  for (pdVar5 = _Stack_101a8._M_impl.super__Vector_impl_data._M_start;
      pdVar5 != _Stack_101a8._M_impl.super__Vector_impl_data._M_finish; pdVar5 = pdVar5 + 1) {
    *pdVar5 = *pdVar5 * dVar1;
  }
  std::__cxx11::string::string((string *)&sStack_10048,(string *)&puStack_10080);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&_Stack_10098,
             (vector<double,_std::allocator<double>_> *)&_Stack_10148);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)(auStack_10108 + 0x58),
             (vector<double,_std::allocator<double>_> *)&_Stack_10168);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&_Stack_10060,
             (vector<double,_std::allocator<double>_> *)&_Stack_101a8);
  EAMAdapter::makeFuncfl
            (&EStack_10110,dStack_101b8,&sStack_10048,iVar3,RStack_101b0,num,dStack_101c8,
             dStack_101c0,(vector<double,_std::allocator<double>_> *)&_Stack_10098,
             (vector<double,_std::allocator<double>_> *)(auStack_10108 + 0x58),
             (vector<double,_std::allocator<double>_> *)&_Stack_10060);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_10060);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)(auStack_10108 + 0x58));
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_10098);
  std::__cxx11::string::~string((string *)&sStack_10048);
  (*(input->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream[1])(input);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_10168);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_10148);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_101a8);
  std::__cxx11::string::~string((string *)&puStack_10080);
  return;
}

Assistant:

void EAMAtomTypesSectionParser::parseFuncflFile(ForceField& ff, EAMAdapter ea,
                                                  const string& funcflFile,
                                                  int) {
    ifstrstream* ppfStream = ff.openForceFieldFile(funcflFile);
    const int bufferSize   = 65535;
    char buffer[bufferSize];

    // skip first line
    ppfStream->getline(buffer, bufferSize);

    // The second line contains atomic number, atomic mass, a lattice
    // constant and lattice type
    int atomicNumber;
    RealType atomicMass;
    RealType latticeConstant(0.0);
    std::string lattice;

    // The third line is nrho, drho, nr, dr and rcut
    int nrho(0);
    RealType drho(0.0);
    int nr(0);
    RealType dr(0.0);
    RealType rcut(0.0);
    std::vector<RealType> F;
    std::vector<RealType> Z;
    std::vector<RealType> rho;

    if (ppfStream->getline(buffer, bufferSize)) {
      StringTokenizer tokenizer1(buffer);

      if (tokenizer1.countTokens() >= 4) {
        atomicNumber    = tokenizer1.nextTokenAsInt();
        atomicMass      = tokenizer1.nextTokenAsDouble();
        latticeConstant = tokenizer1.nextTokenAsDouble() * dus_;
        lattice         = tokenizer1.nextToken();
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "EAMAtomTypesSectionParser Error: "
                 "Not enough tokens\n");
        painCave.isFatal = 1;
        simError();
      }
    }

    FIX_UNUSED(atomicNumber);
    FIX_UNUSED(atomicMass);

    if (ppfStream->getline(buffer, bufferSize)) {
      StringTokenizer tokenizer2(buffer);

      if (tokenizer2.countTokens() >= 5) {
        nrho = tokenizer2.nextTokenAsInt();
        drho = tokenizer2.nextTokenAsDouble();
        nr   = tokenizer2.nextTokenAsInt();
        dr   = tokenizer2.nextTokenAsDouble() * dus_;
        rcut = tokenizer2.nextTokenAsDouble() * dus_;
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "EAMAtomTypesSectionParser Error: "
                 "Not enough tokens\n");
        painCave.isFatal = 1;
        simError();
      }
    }

    parseEAMArray(*ppfStream, F, nrho);
    parseEAMArray(*ppfStream, Z, nr);
    parseEAMArray(*ppfStream, rho, nr);

    // Convert to kcal/mol using energy unit scaling in force field:
    std::transform(
        F.begin(), F.end(), F.begin(),
        std::bind(std::multiplies<RealType>(), eus_, std::placeholders::_1));

    ea.makeFuncfl(latticeConstant, lattice, nrho, drho, nr, dr, rcut, Z, rho,
                  F);

    delete ppfStream;
  }